

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonBlobAppendNode(JsonParse *pParse,u8 eType,u32 szPayload,void *aPayload)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  void *in_RCX;
  uint in_EDX;
  byte in_SIL;
  long *in_RDI;
  u8 *a;
  u32 in_stack_ffffffffffffffd8;
  u8 in_stack_ffffffffffffffdf;
  
  if (*(uint *)((long)in_RDI + 0xc) < (int)in_RDI[1] + in_EDX + 9) {
    jsonBlobExpandAndAppendNode
              ((JsonParse *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffdf,
               in_stack_ffffffffffffffd8,(void *)0x23493b);
  }
  else {
    pbVar3 = (byte *)(*in_RDI + (ulong)*(uint *)(in_RDI + 1));
    if (in_EDX < 0xc) {
      *pbVar3 = in_SIL | (byte)(in_EDX << 4);
      *(int *)(in_RDI + 1) = (int)in_RDI[1] + 1;
    }
    else {
      bVar1 = (byte)in_EDX;
      if (in_EDX < 0x100) {
        *pbVar3 = in_SIL | 0xc0;
        pbVar3[1] = bVar1;
        *(int *)(in_RDI + 1) = (int)in_RDI[1] + 2;
      }
      else {
        bVar2 = (byte)(in_EDX >> 8);
        if (in_EDX < 0x10000) {
          *pbVar3 = in_SIL | 0xd0;
          pbVar3[1] = bVar2;
          pbVar3[2] = bVar1;
          *(int *)(in_RDI + 1) = (int)in_RDI[1] + 3;
        }
        else {
          *pbVar3 = in_SIL | 0xe0;
          pbVar3[1] = (byte)(in_EDX >> 0x18);
          pbVar3[2] = (byte)(in_EDX >> 0x10);
          pbVar3[3] = bVar2;
          pbVar3[4] = bVar1;
          *(int *)(in_RDI + 1) = (int)in_RDI[1] + 5;
        }
      }
    }
    if (in_RCX != (void *)0x0) {
      *(uint *)(in_RDI + 1) = in_EDX + (int)in_RDI[1];
      memcpy((void *)(*in_RDI + (ulong)((int)in_RDI[1] - in_EDX)),in_RCX,(ulong)in_EDX);
    }
  }
  return;
}

Assistant:

static void jsonBlobAppendNode(
  JsonParse *pParse,          /* The JsonParse object under construction */
  u8 eType,                   /* Node type.  One of JSONB_* */
  u32 szPayload,              /* Number of bytes of payload */
  const void *aPayload        /* The payload.  Might be NULL */
){
  u8 *a;
  if( pParse->nBlob+szPayload+9 > pParse->nBlobAlloc ){
    jsonBlobExpandAndAppendNode(pParse,eType,szPayload,aPayload);
    return;
  }
  assert( pParse->aBlob!=0 );
  a = &pParse->aBlob[pParse->nBlob];
  if( szPayload<=11 ){
    a[0] = eType | (szPayload<<4);
    pParse->nBlob += 1;
  }else if( szPayload<=0xff ){
    a[0] = eType | 0xc0;
    a[1] = szPayload & 0xff;
    pParse->nBlob += 2;
  }else if( szPayload<=0xffff ){
    a[0] = eType | 0xd0;
    a[1] = (szPayload >> 8) & 0xff;
    a[2] = szPayload & 0xff;
    pParse->nBlob += 3;
  }else{
    a[0] = eType | 0xe0;
    a[1] = (szPayload >> 24) & 0xff;
    a[2] = (szPayload >> 16) & 0xff;
    a[3] = (szPayload >> 8) & 0xff;
    a[4] = szPayload & 0xff;
    pParse->nBlob += 5;
  }
  if( aPayload ){
    pParse->nBlob += szPayload;
    memcpy(&pParse->aBlob[pParse->nBlob-szPayload], aPayload, szPayload);
  }
}